

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhash.c
# Opt level: O2

rhash rhash_init(uint hash_id)

{
  size_t count;
  int *piVar1;
  rhash prVar2;
  uint uVar3;
  uint *hash_ids_00;
  uint hash_id_local;
  uint hash_ids [32];
  
  hash_id_local = hash_id;
  if (hash_id - 1 < 0x3ff) {
    if ((hash_id + 0x3ff & hash_id) == 0) {
      count = 1;
      hash_ids_00 = &hash_id_local;
    }
    else {
      count = 0;
      for (uVar3 = -hash_id & hash_id; uVar3 <= hash_id; uVar3 = uVar3 * 2) {
        if (uVar3 == 0) {
          __assert_fail("id != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibrhash/librhash/rhash.c"
                        ,0xad,"rhash rhash_init(unsigned int)");
        }
        if ((uVar3 & hash_id) != 0) {
          hash_ids[count] = uVar3;
          count = count + 1;
        }
      }
      if (count < 2) {
        __assert_fail("count > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibrhash/librhash/rhash.c"
                      ,0xb1,"rhash rhash_init(unsigned int)");
      }
      hash_ids_00 = hash_ids;
    }
    prVar2 = rhash_init_multi(count,hash_ids_00);
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    prVar2 = (rhash)0x0;
  }
  return prVar2;
}

Assistant:

RHASH_API rhash rhash_init(unsigned hash_id)
{
	if (!IS_VALID_HASH_MASK(hash_id)) {
		errno = EINVAL;
		return NULL;
	}
	if (HAS_ZERO_OR_ONE_BIT(hash_id)) {
		return rhash_init_multi(1, &hash_id);
	} else {
		/* handle the depricated case, when hash_id is a bitwise union of several hash function identifiers */
		size_t count;
		unsigned hash_ids[32];
		unsigned id = hash_id & -hash_id; /* get the trailing bit */
		for (count = 0; id <= hash_id; id = id << 1) {
			assert(id != 0);
			if (hash_id & id)
				hash_ids[count++] = id;
		}
		assert(count > 1);
		return rhash_init_multi(count, hash_ids);
	}
}